

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::MixedMaxAttributesTest::iterate(MixedMaxAttributesTest *this)

{
  deInt32 dVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_type *psVar4;
  deUint32 layoutLocation;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  uint uVar7;
  string local_2e8;
  int local_2c4;
  long *local_2c0 [2];
  long local_2b0 [2];
  AttribType *local_2a0;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  Attribute local_258;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  ostringstream s;
  undefined7 uStack_1b7;
  _Alloc_hider _Stack_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [5];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  local_2c4 = 1;
  if (this->m_arraySize != -1) {
    local_2c4 = this->m_arraySize;
  }
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _s = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_1b0,"GL_MAX_VERTEX_ATTRIBS: ",0x17);
  std::ostream::operator<<((ostringstream *)&_Stack_1b0,dVar1);
  tcu::MessageBuilder::operator<<((MessageBuilder *)&s,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  layoutLocation = dVar1 - (this->m_type).m_locationSize * local_2c4;
  if (-1 < (int)layoutLocation) {
    local_2a0 = &this->m_type;
    uVar7 = 0;
    do {
      if ((uVar7 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((Cond *)&s,uVar7);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base(local_148);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0x685933);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        psVar4 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_2e8.field_2._M_allocated_capacity = *psVar4;
          local_2e8.field_2._8_8_ = plVar2[3];
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar4;
          local_2e8._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_2e8._M_string_length = plVar2[1];
        *plVar2 = (long)psVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        _s = (TestLog *)CONCAT71(uStack_1b7,1);
        local_1a0[0]._M_allocated_capacity = 0x737961776c615f5f;
        local_1a0[0]._8_2_ = 0x5f5f;
        local_1a8 = 10;
        local_1a0[0]._M_local_buf[10] = '\0';
        _Stack_1b0._M_p = (pointer)local_1a0;
        AttributeLocationTestUtil::Attribute::Attribute
                  (&local_258,local_2a0,&local_2e8,-1,(Cond *)&s,this->m_arraySize);
        std::
        vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
        ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_cond.m_name._M_dataplus._M_p != &local_258.m_cond.m_name.field_2) {
          operator_delete(local_258.m_cond.m_name._M_dataplus._M_p,
                          local_258.m_cond.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_name._M_dataplus._M_p != &local_258.m_name.field_2) {
          operator_delete(local_258.m_name._M_dataplus._M_p,
                          local_258.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_type.m_name._M_dataplus._M_p != &local_258.m_type.m_name.field_2) {
          operator_delete(local_258.m_type.m_name._M_dataplus._M_p,
                          local_258.m_type.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_1b0._M_p != local_1a0) {
          operator_delete(_Stack_1b0._M_p,local_1a0[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_2c0[0] != local_2b0) {
          operator_delete(local_2c0[0],local_2b0[0] + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((Cond *)&s,uVar7);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base(local_148);
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0x685933);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        psVar4 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_2e8.field_2._M_allocated_capacity = *psVar4;
          local_2e8.field_2._8_8_ = puVar3[3];
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar4;
          local_2e8._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_2e8._M_string_length = puVar3[1];
        *puVar3 = psVar4;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        local_258.m_type.m_name._M_dataplus._M_p = (pointer)&local_258.m_type.m_name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_2e8._M_dataplus._M_p,
                   local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
        local_258.m_type.m_locationSize = layoutLocation;
        std::
        vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
        ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_258);
        uVar5 = local_258.m_type.m_name.field_2._M_allocated_capacity;
        _Var6._M_p = local_258.m_type.m_name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_type.m_name._M_dataplus._M_p != &local_258.m_type.m_name.field_2) {
LAB_004d5e49:
          operator_delete(_Var6._M_p,uVar5 + 1);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((Cond *)&s,uVar7);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base(local_148);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0x685933);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        psVar4 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_2e8.field_2._M_allocated_capacity = *psVar4;
          local_2e8.field_2._8_8_ = plVar2[3];
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar4;
          local_2e8._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_2e8._M_string_length = plVar2[1];
        *plVar2 = (long)psVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        _s = (TestLog *)CONCAT71(uStack_1b7,1);
        local_1a0[0]._M_allocated_capacity = 0x737961776c615f5f;
        local_1a0[0]._8_2_ = 0x5f5f;
        local_1a8 = 10;
        local_1a0[0]._M_local_buf[10] = '\0';
        _Stack_1b0._M_p = (pointer)local_1a0;
        AttributeLocationTestUtil::Attribute::Attribute
                  (&local_258,local_2a0,&local_2e8,layoutLocation,(Cond *)&s,this->m_arraySize);
        std::
        vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
        ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_cond.m_name._M_dataplus._M_p != &local_258.m_cond.m_name.field_2) {
          operator_delete(local_258.m_cond.m_name._M_dataplus._M_p,
                          local_258.m_cond.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_name._M_dataplus._M_p != &local_258.m_name.field_2) {
          operator_delete(local_258.m_name._M_dataplus._M_p,
                          local_258.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_type.m_name._M_dataplus._M_p != &local_258.m_type.m_name.field_2) {
          operator_delete(local_258.m_type.m_name._M_dataplus._M_p,
                          local_258.m_type.m_name.field_2._M_allocated_capacity + 1);
        }
        uVar5 = local_1a0[0]._M_allocated_capacity;
        _Var6._M_p = _Stack_1b0._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_1b0._M_p != local_1a0) goto LAB_004d5e49;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if (local_2c0[0] != local_2b0) {
        operator_delete(local_2c0[0],local_2b0[0] + 1);
      }
      uVar7 = uVar7 + 1;
      layoutLocation = layoutLocation - (this->m_type).m_locationSize * local_2c4;
    } while (-1 < (int)layoutLocation);
  }
  _s = (TestLog *)0x0;
  _Stack_1b0._M_p = (pointer)0x0;
  local_1a8 = 0;
  AttributeLocationTestUtil::runTest
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&attributes,
             &noBindings,&bindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&bindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult MixedMaxAttributesTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const deInt32		maxAttributes		= getMaxAttributeLocations(m_renderCtx);
	const int			arrayElementCount	= (m_arraySize != Attribute::NOT_ARRAY ? m_arraySize : 1);

	vector<Bind>		bindings;
	vector<Attribute>	attributes;
	int					ndx = 0;

	m_testCtx.getLog() << TestLog::Message << "GL_MAX_VERTEX_ATTRIBS: " << maxAttributes << TestLog::EndMessage;

	for (int loc = maxAttributes - (arrayElementCount * m_type.getLocationSize()); loc >= 0; loc -= (arrayElementCount * m_type.getLocationSize()))
	{
		if ((ndx % 2) != 0)
			attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx), loc, Cond::COND_ALWAYS, m_arraySize));
		else
		{
			attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx), Attribute::LOC_UNDEF, Cond::COND_ALWAYS, m_arraySize));
			bindings.push_back(Bind("a_" + de::toString(ndx), loc));

		}
		ndx++;
	}

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, bindings, noBindings, false);
	return STOP;
}